

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_cookies(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  _Bool secure;
  char *local_a0;
  size_t add;
  Cookie *co;
  size_t clen;
  Curl_llist_node *n;
  _Bool secure_context;
  char *host;
  int rc;
  int count;
  Curl_llist list;
  char *pcStack_38;
  _Bool linecap;
  char *addcookies;
  CURLcode result;
  dynbuf *r_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  addcookies._4_4_ = CURLE_OK;
  pcStack_38 = (char *)0x0;
  list._size._7_1_ = 0;
  if (((data->set).str[0x1a] != (char *)0x0) &&
     (pcVar2 = Curl_checkheaders(data,"Cookie",6), pcVar2 == (char *)0x0)) {
    pcStack_38 = (data->set).str[0x1a];
  }
  if ((data->cookies != (CookieInfo *)0x0) || (pcStack_38 != (char *)0x0)) {
    host._4_4_ = 0;
    host._0_4_ = 1;
    if ((data->cookies != (CookieInfo *)0x0) &&
       ((*(uint *)&(data->state).field_0x774 >> 0xb & 1) != 0)) {
      if ((data->state).aptr.cookiehost == (char *)0x0) {
        local_a0 = (conn->host).name;
      }
      else {
        local_a0 = (data->state).aptr.cookiehost;
      }
      secure = true;
      if ((conn->handler->protocol & 0x80000002) == 0) {
        iVar1 = curl_strequal("localhost",local_a0);
        secure = true;
        if (iVar1 == 0) {
          iVar1 = strcmp(local_a0,"127.0.0.1");
          secure = true;
          if (iVar1 != 0) {
            iVar1 = strcmp(local_a0,"::1");
            secure = iVar1 == 0;
          }
        }
      }
      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
      host._0_4_ = Curl_cookie_getlist(data,data->cookies,local_a0,(data->state).up.path,secure,
                                       (Curl_llist *)&rc);
      Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    }
    if ((int)host == 0) {
      co = (Cookie *)0x8;
      for (clen = (size_t)Curl_llist_head((Curl_llist *)&rc); clen != 0;
          clen = (size_t)Curl_node_next((Curl_llist_node *)clen)) {
        pvVar3 = Curl_node_elem((Curl_llist_node *)clen);
        if (*(long *)((long)pvVar3 + 0x48) != 0) {
          if ((host._4_4_ == 0) &&
             (addcookies._4_4_ = Curl_dyn_addn(r,"Cookie: ",8), addcookies._4_4_ != CURLE_OK))
          break;
          sVar4 = strlen(*(char **)((long)pvVar3 + 0x40));
          sVar5 = strlen(*(char **)((long)pvVar3 + 0x48));
          lVar6 = sVar4 + sVar5 + 1;
          if (0x1ffd < (ulong)((long)&(co->node)._list + lVar6)) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Restricted outgoing cookies due to header size, \'%s\' not sent",
                         *(undefined8 *)((long)pvVar3 + 0x40));
            }
            list._size._7_1_ = 1;
            break;
          }
          pcVar2 = "";
          if (host._4_4_ != 0) {
            pcVar2 = "; ";
          }
          addcookies._4_4_ =
               Curl_dyn_addf(r,"%s%s=%s",pcVar2,*(undefined8 *)((long)pvVar3 + 0x40),
                             *(undefined8 *)((long)pvVar3 + 0x48));
          if (addcookies._4_4_ != CURLE_OK) break;
          iVar1 = 0;
          if (host._4_4_ != 0) {
            iVar1 = 2;
          }
          co = (Cookie *)((long)&(co->node)._list + lVar6 + iVar1);
          host._4_4_ = host._4_4_ + 1;
        }
      }
      Curl_llist_destroy((Curl_llist *)&rc,(void *)0x0);
    }
    if (((pcStack_38 != (char *)0x0) && (addcookies._4_4_ == CURLE_OK)) &&
       ((list._size._7_1_ & 1) == 0)) {
      if (host._4_4_ == 0) {
        addcookies._4_4_ = Curl_dyn_addn(r,"Cookie: ",8);
      }
      if (addcookies._4_4_ == CURLE_OK) {
        pcVar2 = "";
        if (host._4_4_ != 0) {
          pcVar2 = "; ";
        }
        addcookies._4_4_ = Curl_dyn_addf(r,"%s%s",pcVar2,pcStack_38);
        host._4_4_ = host._4_4_ + 1;
      }
    }
    if ((host._4_4_ != 0) && (addcookies._4_4_ == CURLE_OK)) {
      addcookies._4_4_ = Curl_dyn_addn(r,"\r\n",2);
    }
    if (addcookies._4_4_ != CURLE_OK) {
      return addcookies._4_4_;
    }
  }
  return addcookies._4_4_;
}

Assistant:

CURLcode Curl_http_cookies(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  char *addcookies = NULL;
  bool linecap = FALSE;
  if(data->set.str[STRING_COOKIE] &&
     !Curl_checkheaders(data, STRCONST("Cookie")))
    addcookies = data->set.str[STRING_COOKIE];

  if(data->cookies || addcookies) {
    struct Curl_llist list;
    int count = 0;
    int rc = 1;

    if(data->cookies && data->state.cookie_engine) {
      const char *host = data->state.aptr.cookiehost ?
        data->state.aptr.cookiehost : conn->host.name;
      const bool secure_context =
        conn->handler->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS) ||
        strcasecompare("localhost", host) ||
        !strcmp(host, "127.0.0.1") ||
        !strcmp(host, "::1") ? TRUE : FALSE;
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      rc = Curl_cookie_getlist(data, data->cookies, host, data->state.up.path,
                               secure_context, &list);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    if(!rc) {
      struct Curl_llist_node *n;
      size_t clen = 8; /* hold the size of the generated Cookie: header */

      /* loop through all cookies that matched */
      for(n = Curl_llist_head(&list); n; n = Curl_node_next(n)) {
        struct Cookie *co = Curl_node_elem(n);
        if(co->value) {
          size_t add;
          if(!count) {
            result = Curl_dyn_addn(r, STRCONST("Cookie: "));
            if(result)
              break;
          }
          add = strlen(co->name) + strlen(co->value) + 1;
          if(clen + add >= MAX_COOKIE_HEADER_LEN) {
            infof(data, "Restricted outgoing cookies due to header size, "
                  "'%s' not sent", co->name);
            linecap = TRUE;
            break;
          }
          result = Curl_dyn_addf(r, "%s%s=%s", count ? "; " : "",
                                 co->name, co->value);
          if(result)
            break;
          clen += add + (count ? 2 : 0);
          count++;
        }
      }
      Curl_llist_destroy(&list, NULL);
    }
    if(addcookies && !result && !linecap) {
      if(!count)
        result = Curl_dyn_addn(r, STRCONST("Cookie: "));
      if(!result) {
        result = Curl_dyn_addf(r, "%s%s", count ? "; " : "", addcookies);
        count++;
      }
    }
    if(count && !result)
      result = Curl_dyn_addn(r, STRCONST("\r\n"));

    if(result)
      return result;
  }
  return result;
}